

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::Init
          (MeshEdgebreakerTraversalPredictiveEncoder *this,
          MeshEdgebreakerEncoderImplInterface *encoder)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  CornerTable *this_00;
  CornerTable *pCVar3;
  reference pvVar4;
  MeshEdgebreakerEncoderImplInterface *in_RSI;
  MeshEdgebreakerTraversalEncoder *in_RDI;
  uint32_t i;
  pointer *ppuVar5;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint value;
  bool local_1;
  
  bVar1 = MeshEdgebreakerTraversalEncoder::Init(in_RDI,in_RSI);
  if (bVar1) {
    iVar2 = (*in_RSI->_vptr_MeshEdgebreakerEncoderImplInterface[8])();
    in_RDI[1].start_face_encoder_.bit_counts_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
    ppuVar5 = &in_RDI[1].start_face_encoder_.bit_counts_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    CornerTable::num_vertices((CornerTable *)0x19b4f5);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0.value_),
               (size_type)in_RDI);
    value = 0;
    while( true ) {
      this_00 = (CornerTable *)(ulong)value;
      pCVar3 = (CornerTable *)
               std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[1].start_face_encoder_.bit_counts_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
      if (pCVar3 <= this_00) break;
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType
                ((IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)&stack0xffffffffffffffe0,
                 value);
      iVar2 = CornerTable::Valence(this_00,(VertexIndex)(uint)ppuVar5);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[1].start_face_encoder_.bit_counts_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,(ulong)value);
      *pvVar4 = iVar2;
      value = value + 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Init(MeshEdgebreakerEncoderImplInterface *encoder) {
    if (!MeshEdgebreakerTraversalEncoder::Init(encoder)) {
      return false;
    }
    corner_table_ = encoder->GetCornerTable();
    // Initialize valences of all vertices.
    vertex_valences_.resize(corner_table_->num_vertices());
    for (uint32_t i = 0; i < vertex_valences_.size(); ++i) {
      vertex_valences_[i] = corner_table_->Valence(VertexIndex(i));
    }
    return true;
  }